

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger container_update(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  long idx;
  
  pSVar2 = stack_get(v,1);
  if (((pSVar2->super_SQObject)._flags & 1) != 0) {
    SVar4 = sq_throwerror(v,"Cannot modify immutable object");
    return SVar4;
  }
  SVar3 = sq_gettop(v);
  idx = 2;
  while( true ) {
    if (SVar3 < idx) {
      sq_push(v,1);
      return 1;
    }
    SVar1 = sq_gettype(v,idx);
    if ((SVar1 & 0xc020) == 0) break;
    sq_pushnull(v);
    while (SVar4 = sq_next(v,idx), -1 < SVar4) {
      sq_newslot(v,1,0);
    }
    sq_pop(v,1);
    idx = idx + 1;
  }
  SQVM::Raise_ParamTypeError(v,idx,0xc020,(ulong)SVar1);
  return -1;
}

Assistant:

static SQInteger container_update(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQInteger top = sq_gettop(v);
    for (int arg=2; arg<=top; ++arg) {
        SQObjectType argType = sq_gettype(v, arg);
        if (!(argType & (_RT_TABLE | _RT_CLASS | _RT_INSTANCE))) {
            v->Raise_ParamTypeError(arg, _RT_TABLE | _RT_CLASS | _RT_INSTANCE, argType);
            return SQ_ERROR;
        }

        sq_pushnull(v);
        while (SQ_SUCCEEDED(sq_next(v, arg))) {
            sq_newslot(v, 1, false);
        }
        sq_pop(v, 1); // pops the iterator
    }
    sq_push(v, 1);
    return 1;
}